

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.h
# Opt level: O3

void __thiscall
r_exec::Input::Input(Input *this,View *input,_Fact *abstraction,BindingMap *bindings)

{
  atomic_int_fast64_t *paVar1;
  _Object *p_Var2;
  bool bVar3;
  ushort uVar4;
  uint64_t uVar5;
  
  (this->bindings).object = &bindings->super__Object;
  if (bindings != (BindingMap *)0x0) {
    LOCK();
    paVar1 = &(bindings->super__Object).refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  (this->abstraction).object = (_Object *)abstraction;
  if (abstraction != (_Fact *)0x0) {
    LOCK();
    paVar1 = &(abstraction->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
              super_LObject.super_Code.super__Object.refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  p_Var2 = (input->super_View).object.object;
  (this->input).object = p_Var2;
  if (p_Var2 != (_Object *)0x0) {
    LOCK();
    (p_Var2->refCount).super___atomic_base<long>._M_i =
         (p_Var2->refCount).super___atomic_base<long>._M_i + 1;
    UNLOCK();
  }
  bVar3 = IsEligibleCause(input);
  this->eligible_cause = bVar3;
  uVar4 = r_code::Atom::asIndex();
  uVar5 = r_code::Utils::GetTimestamp
                    ((Atom *)((long)(input->super_View).references + (ulong)uVar4 * 4 + 0x18));
  this->ijt = uVar5;
  return;
}

Assistant:

Input(View *input, _Fact *abstraction, BindingMap *bindings): bindings(bindings), abstraction(abstraction), input(input->object), eligible_cause(IsEligibleCause(input)), ijt(input->get_ijt()) {}